

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

FString BuildString(int argc,FString *argv)

{
  char *pcVar1;
  long lVar2;
  FString *pFVar3;
  char *pcVar4;
  FString *this;
  FString *in_RDX;
  undefined4 in_register_0000003c;
  FString *this_00;
  size_t numChars;
  FString local_50;
  ulong local_48;
  FString *local_40;
  ulong local_38;
  
  this_00 = (FString *)CONCAT44(in_register_0000003c,argc);
  if ((int)argv == 1) {
    FString::AttachToOther(this_00,in_RDX);
  }
  else {
    this_00->Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    if (0 < (int)argv) {
      local_48 = (ulong)argv & 0xffffffff;
      local_38 = 0;
      local_40 = in_RDX;
      do {
        pFVar3 = local_40 + local_38;
        pcVar4 = pFVar3->Chars;
        pcVar1 = strchr(pcVar4,0x22);
        if (pcVar1 == (char *)0x0) {
          pcVar4 = strchr(pcVar4,0x20);
          if (pcVar4 == (char *)0x0) {
            pFVar3 = FString::operator+=(this_00,pFVar3);
            FString::operator+=(pFVar3,' ');
          }
          else {
            this = FString::operator+=(this_00,'\"');
            pFVar3 = FString::operator+=(this,pFVar3);
            FString::operator+=(pFVar3,"\" ");
          }
        }
        else {
          FString::operator+=(this_00,'\"');
          numChars = 0;
          while( true ) {
            lVar2 = FString::IndexOf(pFVar3,'\"',numChars);
            if (lVar2 < 0) break;
            if ((long)numChars < lVar2) {
              FString::Mid(&local_50,(size_t)pFVar3,numChars);
              FString::operator+=(this_00,&local_50);
              FString::~FString(&local_50);
            }
            FString::operator+=(this_00,"\\\"");
            numChars = lVar2 + 1;
          }
          FString::Mid(&local_50,(size_t)pFVar3,numChars);
          pFVar3 = FString::operator+=(this_00,&local_50);
          FString::operator+=(pFVar3,"\" ");
          FString::~FString(&local_50);
        }
        local_38 = local_38 + 1;
      } while (local_38 != local_48);
    }
  }
  return (FString)(char *)this_00;
}

Assistant:

FString BuildString (int argc, FString *argv)
{
	if (argc == 1)
	{
		return *argv;
	}
	else
	{
		FString buf;
		int arg;

		for (arg = 0; arg < argc; arg++)
		{
			if (strchr(argv[arg], '"'))
			{ // If it contains one or more quotes, we need to escape them.
				buf << '"';
				long substr_start = 0, quotepos;
				while ((quotepos = argv[arg].IndexOf('"', substr_start)) >= 0)
				{
					if (substr_start < quotepos)
					{
						buf << argv[arg].Mid(substr_start, quotepos - substr_start);
					}
					buf << "\\\"";
					substr_start = quotepos + 1;
				}
				buf << argv[arg].Mid(substr_start) << "\" ";
			}
			else if (strchr(argv[arg], ' '))
			{ // If it contains a space, it needs to be quoted.
				buf << '"' << argv[arg] << "\" ";
			}
			else
			{
				buf << argv[arg] << ' ';
			}
		}
		return buf;
	}
}